

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_is_not_hardlink(char *file,wchar_t line,char *path1,char *path2)

{
  wchar_t wVar1;
  char *path2_local;
  char *path1_local;
  wchar_t line_local;
  char *file_local;
  
  wVar1 = is_hardlink(file,line,path1,path2);
  if (wVar1 != L'\0') {
    failure_start(file,line,"Files %s and %s should not be hardlinked",path1,path2);
    failure_finish((void *)0x0);
  }
  file_local._4_4_ = (wchar_t)(wVar1 == L'\0');
  return file_local._4_4_;
}

Assistant:

int
assertion_is_not_hardlink(const char *file, int line,
    const char *path1, const char *path2)
{
	if (!is_hardlink(file, line, path1, path2))
		return (1);
	failure_start(file, line,
	    "Files %s and %s should not be hardlinked", path1, path2);
	failure_finish(NULL);
	return (0);
}